

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConfigCellIdentifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigCellIdentifierSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Token library;
  Token dot;
  Token cell;
  ConfigCellIdentifierSyntax *this_00;
  Token *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ConfigCellIdentifierSyntax *)allocate(this,0x40,8);
  library.kind = args->kind;
  library._2_1_ = args->field_0x2;
  library.numFlags.raw = (args->numFlags).raw;
  library.rawLen = args->rawLen;
  library.info = args->info;
  dot.kind = args_1->kind;
  dot._2_1_ = args_1->field_0x2;
  dot.numFlags.raw = (args_1->numFlags).raw;
  dot.rawLen = args_1->rawLen;
  dot.info = args_1->info;
  cell.kind = args_2->kind;
  cell._2_1_ = args_2->field_0x2;
  cell.numFlags.raw = (args_2->numFlags).raw;
  cell.rawLen = args_2->rawLen;
  cell.info = args_2->info;
  slang::syntax::ConfigCellIdentifierSyntax::ConfigCellIdentifierSyntax(this_00,library,dot,cell);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }